

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

CZString * __thiscall Json::Value::CZString::operator=(CZString *this,CZString *other)

{
  undefined1 local_28 [8];
  CZString temp;
  CZString *other_local;
  CZString *this_local;
  
  temp._8_8_ = other;
  CZString((CZString *)local_28,other);
  swap(this,(CZString *)local_28);
  ~CZString((CZString *)local_28);
  return this;
}

Assistant:

Value::CZString &
Value::CZString::operator =( const CZString &other )
{
   CZString temp( other );
   swap( temp );
   return *this;
}